

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

SplitTuplePromise<kj::_::Tuple<int,_kj::String,_kj::Promise<int>_>_> * __thiscall
kj::_::ForkHub<kj::_::Tuple<int,kj::String,kj::Promise<int>>>::splitImpl<0ul,1ul,2ul>
          (SplitTuplePromise<kj::_::Tuple<int,_kj::String,_kj::Promise<int>_>_>
           *__return_storage_ptr__)

{
  Disposer *local_48;
  PromiseNode *pPStack_40;
  Disposer *local_38;
  PromiseNode *pPStack_30;
  Disposer *local_28;
  PromiseNode *pPStack_20;
  
  addSplit<0ul>((ForkHub<kj::_::Tuple<int,kj::String,kj::Promise<int>>> *)&local_38);
  addSplit<1ul>((ForkHub<kj::_::Tuple<int,kj::String,kj::Promise<int>>> *)&local_48);
  addSplit<2ul>((ForkHub<kj::_::Tuple<int,kj::String,kj::Promise<int>>> *)&local_28);
  (__return_storage_ptr__->impl).super_TupleElement<0U,_kj::Promise<int>_>.value.super_PromiseBase.
  node.disposer = local_38;
  (__return_storage_ptr__->impl).super_TupleElement<0U,_kj::Promise<int>_>.value.super_PromiseBase.
  node.ptr = pPStack_30;
  (__return_storage_ptr__->impl).super_TupleElement<1U,_kj::Promise<kj::String>_>.value.
  super_PromiseBase.node.disposer = local_48;
  (__return_storage_ptr__->impl).super_TupleElement<1U,_kj::Promise<kj::String>_>.value.
  super_PromiseBase.node.ptr = pPStack_40;
  (__return_storage_ptr__->impl).super_TupleElement<2U,_kj::Promise<int>_>.value.super_PromiseBase.
  node.disposer = local_28;
  (__return_storage_ptr__->impl).super_TupleElement<2U,_kj::Promise<int>_>.value.super_PromiseBase.
  node.ptr = pPStack_20;
  return __return_storage_ptr__;
}

Assistant:

_::SplitTuplePromise<T> splitImpl(Indexes<indexes...>) {
    return kj::tuple(addSplit<indexes>()...);
  }